

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadQuadLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer pcVar1;
  undefined8 *in_RDX;
  XMLLoader *this_00;
  string *childID;
  float fVar2;
  float fVar3;
  Vec3fa VVar4;
  Vec3fa L;
  AffineSpace3fa space;
  undefined1 local_d0 [16];
  element_type *peStack_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  ssize_t local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_a8;
  float local_98;
  float fStack_94;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  this_00 = (XMLLoader *)*in_RDX;
  local_a8._vptr__Sp_counted_base._0_2_ = 0x6641;
  local_a8._vptr__Sp_counted_base._2_5_ = 0x53656e6966;
  local_a8._7_4_ = 0x65636170;
  local_b0 = 0xb;
  local_a8._M_use_count._3_1_ = 0;
  local_b8._M_pi = &local_a8;
  XML::child((XML *)(local_d0 + 8),(string *)this_00);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)&local_58.field_1,this_00,(Ref<embree::XML> *)(local_d0 + 8));
  if (local_d0._8_8_ != 0) {
    (**(code **)(*(long *)local_d0._8_8_ + 0x18))();
  }
  if (local_b8._M_pi != &local_a8) {
    operator_delete(local_b8._M_pi);
  }
  childID = (string *)*in_RDX;
  local_a8._vptr__Sp_counted_base._0_2_ = 0x4c;
  local_b0 = 1;
  local_b8._M_pi = &local_a8;
  XML::child((XML *)local_d0,childID);
  VVar4 = load<embree::Vec3fa>((XMLLoader *)(local_d0 + 8),(Ref<embree::XML> *)childID);
  if ((_func_int **)local_d0._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_d0._0_8_ + 0x18))(VVar4.field_0._0_4_,VVar4.field_0._8_4_);
  }
  if (local_b8._M_pi != &local_a8) {
    operator_delete(local_b8._M_pi);
  }
  local_28 = local_38 * 0.0 + local_28;
  fStack_24 = fStack_34 * 0.0 + fStack_24;
  fStack_20 = fStack_30 * 0.0 + fStack_20;
  fStack_1c = fStack_2c * 0.0 + fStack_1c;
  fVar2 = local_48 * 0.0 + local_28;
  fVar3 = fStack_44 * 0.0 + fStack_24;
  fStack_80 = fStack_40 * 0.0 + fStack_20;
  fStack_7c = fStack_3c * 0.0 + fStack_1c;
  local_28 = local_28 + local_48;
  fStack_24 = fStack_24 + fStack_44;
  fStack_20 = fStack_20 + fStack_40;
  fStack_1c = fStack_1c + fStack_3c;
  local_68 = local_58.m128[0] + local_28;
  fStack_64 = local_58.m128[1] + fStack_24;
  fStack_60 = local_58.m128[2] + fStack_20;
  fStack_5c = local_58.m128[3] + fStack_1c;
  local_78 = local_28 + local_58.m128[0] * 0.0;
  fStack_74 = fStack_24 + local_58.m128[1] * 0.0;
  fStack_70 = fStack_20 + local_58.m128[2] * 0.0;
  fStack_6c = fStack_1c + local_58.m128[3] * 0.0;
  local_98 = local_58.m128[0] * 0.0 + fVar2;
  fStack_94 = local_58.m128[1] * 0.0 + fVar3;
  aStack_90._M_allocated_capacity._0_4_ = local_58.m128[2] * 0.0 + fStack_80;
  aStack_90._M_allocated_capacity._4_4_ = local_58.m128[3] * 0.0 + fStack_7c;
  aStack_90._8_4_ = fVar2 + local_58.m128[0];
  aStack_90._12_4_ = fVar3 + local_58.m128[1];
  fStack_80 = fStack_80 + local_58.m128[2];
  fStack_7c = fStack_7c + local_58.m128[3];
  pcVar1 = (pointer)alignedMalloc(0xd0,0x10);
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  *(pointer *)(pcVar1 + 0x10) = pcVar1 + 0x20;
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[0x20] = '\0';
  *(pointer *)(pcVar1 + 0x30) = pcVar1 + 0x40;
  pcVar1[0x38] = '\0';
  pcVar1[0x39] = '\0';
  pcVar1[0x3a] = '\0';
  pcVar1[0x3b] = '\0';
  pcVar1[0x3c] = '\0';
  pcVar1[0x3d] = '\0';
  pcVar1[0x3e] = '\0';
  pcVar1[0x3f] = '\0';
  pcVar1[0x40] = '\0';
  pcVar1[0x50] = '\0';
  pcVar1[0x51] = '\0';
  pcVar1[0x52] = '\0';
  pcVar1[0x53] = '\0';
  pcVar1[0x54] = '\0';
  pcVar1[0x55] = '\0';
  pcVar1[0x56] = '\0';
  pcVar1[0x57] = '\0';
  pcVar1[0x58] = '\0';
  pcVar1[0x59] = '\0';
  pcVar1[0x5c] = -1;
  pcVar1[0x5d] = -1;
  pcVar1[0x5e] = -1;
  pcVar1[0x5f] = -1;
  pcVar1[0x60] = '\0';
  pcVar1[0x61] = '\0';
  pcVar1[0x62] = '\0';
  pcVar1[99] = '\0';
  pcVar1[100] = '\0';
  pcVar1[0x65] = '\0';
  pcVar1[0x66] = '\0';
  pcVar1[0x67] = '\0';
  *(undefined ***)pcVar1 = &PTR__Node_002c7128;
  pcVar1[0x70] = '\x06';
  pcVar1[0x71] = '\0';
  pcVar1[0x72] = '\0';
  pcVar1[0x73] = '\0';
  *(ulong *)(pcVar1 + 0x80) = CONCAT44(fStack_94,local_98);
  *(ulong *)(pcVar1 + 0x88) =
       CONCAT44(aStack_90._M_allocated_capacity._4_4_,aStack_90._M_allocated_capacity._0_4_);
  *(ulong *)(pcVar1 + 0x90) = CONCAT44(fStack_74,local_78);
  *(ulong *)(pcVar1 + 0x98) = CONCAT44(fStack_6c,fStack_70);
  *(ulong *)(pcVar1 + 0xa0) = CONCAT44(fStack_64,local_68);
  *(ulong *)(pcVar1 + 0xa8) = CONCAT44(fStack_5c,fStack_60);
  *(ulong *)(pcVar1 + 0xb0) = CONCAT44(aStack_90._12_4_,aStack_90._8_4_);
  *(ulong *)(pcVar1 + 0xb8) = CONCAT44(fStack_7c,fStack_80);
  ((__atomic_base<unsigned_long> *)(pcVar1 + 0xc0))->_M_i = local_d0._8_8_;
  *(element_type **)(pcVar1 + 200) = peStack_c0;
  (this->path).filename._M_dataplus._M_p = pcVar1;
  LOCK();
  *(long *)(pcVar1 + 8) = *(long *)(pcVar1 + 8) + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadQuadLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    const Vec3fa v0 = xfmPoint(space, Vec3fa(0, 0, 0));
    const Vec3fa v1 = xfmPoint(space, Vec3fa(0, 1, 0));
    const Vec3fa v2 = xfmPoint(space, Vec3fa(1, 1, 0));
    const Vec3fa v3 = xfmPoint(space, Vec3fa(1, 0, 0));
    return new SceneGraph::LightNodeImpl<SceneGraph::QuadLight>(SceneGraph::QuadLight(v0,v1,v2,v3,L));
  }